

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Exe.H
# Opt level: O2

void amrex::parser_compile(amrex_parser *parser,char *p)

{
  int stack_size;
  int max_stack_size;
  Vector<char_*,_std::allocator<char_*>_> local_variables;
  size_t exe_size;
  char *local_38;
  int local_30 [2];
  _Vector_base<char_*,_std::allocator<char_*>_> local_28;
  size_t local_10;
  
  local_10 = 0;
  local_30[1] = 0;
  local_30[0] = 0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = p;
  parser_compile_exe_size
            (parser->ast,&local_38,&local_10,local_30 + 1,local_30,
             (Vector<char_*,_std::allocator<char_*>_> *)&local_28);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

inline void
parser_compile (struct amrex_parser* parser, char* p)
{
    std::size_t exe_size = 0;
    int max_stack_size = 0;
    int stack_size = 0;
    Vector<char*> local_variables;
    parser_compile_exe_size(parser->ast, p, exe_size, max_stack_size, stack_size, local_variables);
    new(p) ParserExeNull;
}